

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall chrono::ChOptimizer::ChOptimizer(ChOptimizer *this,ChOptimizer *other)

{
  long lVar1;
  double *pdVar2;
  int iVar3;
  
  this->_vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizer_00b3a930;
  strcpy(this->err_message,other->err_message);
  this->minimize = other->minimize;
  this->error_code = other->error_code;
  lVar1 = other->grad_evaluations;
  this->fx_evaluations = other->fx_evaluations;
  this->grad_evaluations = lVar1;
  this->grad_step = other->grad_step;
  this->C_vars = other->C_vars;
  pdVar2 = other->xv_sup;
  this->xv = other->xv;
  this->xv_sup = pdVar2;
  this->xv_inf = other->xv_inf;
  this->break_funct = other->break_funct;
  this->break_cyclecounter = other->break_cyclecounter;
  iVar3 = other->user_break;
  this->break_cycles = other->break_cycles;
  this->user_break = iVar3;
  return;
}

Assistant:

ChOptimizer::ChOptimizer(const ChOptimizer& other) {
    // copy error message
    strcpy(err_message, other.err_message);

    minimize = other.minimize;
    error_code = other.error_code;
    fx_evaluations = other.fx_evaluations;
    grad_evaluations = other.grad_evaluations;
    grad_step = other.grad_step;
    C_vars = other.C_vars;

    xv = other.xv;
    xv_sup = other.xv_sup;
    xv_inf = other.xv_inf;

    break_funct = other.break_funct;
    break_cycles = other.break_cycles;
    break_cyclecounter = other.break_cyclecounter;
    user_break = other.user_break;
}